

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_basic_operations.c
# Opt level: O0

void base_shift_left(cpu_registers *registers,uint8_t *value_to_shift)

{
  byte bVar1;
  uint16_t result;
  uint16_t carry_bit_position;
  uint8_t *value_to_shift_local;
  cpu_registers *registers_local;
  
  bVar1 = *value_to_shift;
  *value_to_shift = (uint8_t)((ushort)bVar1 << 1);
  if (((ushort)bVar1 << 1 & 0x100) == 0) {
    clear_cpu_flag(registers,'\x01');
  }
  else {
    set_cpu_flag(registers,'\x01');
  }
  determine_zero_flag(registers,*value_to_shift);
  determine_negative_flag(registers,*value_to_shift);
  return;
}

Assistant:

void base_shift_left(cpu_registers* registers, uint8_t* value_to_shift) {
    const uint16_t carry_bit_position = 0x100;
    uint16_t result = *value_to_shift << 1;
    *value_to_shift = result & BYTE_MASK;

    if(result & carry_bit_position) set_cpu_flag(registers, CARRY_FLAG);
    else clear_cpu_flag(registers, CARRY_FLAG);
    determine_zero_flag(registers, *value_to_shift);
    determine_negative_flag(registers, *value_to_shift);
}